

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.hpp
# Opt level: O0

SPIRFunction * __thiscall
diligent_spirv_cross::Parser::set<diligent_spirv_cross::SPIRFunction,unsigned_int&,unsigned_int&>
          (Parser *this,uint32_t id,uint *args,uint *args_1)

{
  Variant *var_00;
  TypedID<(diligent_spirv_cross::Types)0> local_3c;
  SPIRFunction *local_38;
  SPIRFunction *var;
  uint *local_28;
  uint *args_local_1;
  uint *args_local;
  Parser *pPStack_10;
  uint32_t id_local;
  Parser *this_local;
  
  local_28 = args_1;
  args_local_1 = args;
  args_local._4_4_ = id;
  pPStack_10 = this;
  TypedID<(diligent_spirv_cross::Types)0>::TypedID
            ((TypedID<(diligent_spirv_cross::Types)0> *)((long)&var + 4),id);
  ParsedIR::add_typed_id(&this->ir,TypeFunction,var._4_4_);
  var_00 = VectorView<diligent_spirv_cross::Variant>::operator[]
                     (&(this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>,
                      (ulong)args_local._4_4_);
  local_38 = variant_set<diligent_spirv_cross::SPIRFunction,unsigned_int&,unsigned_int&>
                       (var_00,args_local_1,local_28);
  TypedID<(diligent_spirv_cross::Types)0>::TypedID(&local_3c,args_local._4_4_);
  (local_38->super_IVariant).self.id = local_3c.id;
  return local_38;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		return var;
	}